

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O1

void merge_cache_lcp_2way<false,unsigned_short>
               (uchar **from0,lcp_t *lcp_input0,unsigned_short *cache_input0,size_t n0,uchar **from1
               ,lcp_t *lcp_input1,unsigned_short *cache_input1,size_t n1,uchar **result,
               lcp_t *lcp_result,unsigned_short *cache_result)

{
  uchar *puVar1;
  uchar *puVar2;
  char *pcVar3;
  int iVar4;
  ostream *poVar5;
  size_t sVar6;
  lcp_t *plVar7;
  long lVar8;
  ushort uVar9;
  ushort c;
  uchar **ppuVar10;
  lcp_t lVar11;
  ushort *puVar12;
  ushort c_00;
  uchar **ppuVar13;
  uchar **__dest;
  uchar **ppuVar14;
  long lVar15;
  bool bVar16;
  bool bVar17;
  size_t local_d8;
  uchar **local_c8;
  lcp_t *local_c0;
  lcp_t local_b8;
  ulong local_b0;
  size_t local_a0;
  lcp_t *local_98;
  uint16_t *local_88;
  string local_70;
  string local_50;
  
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"merge_cache_lcp_2way",0x14);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(): n0=",7);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", n1=",5);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  local_70._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_70,1);
  check_input<unsigned_short>(from0,lcp_input0,cache_input0,n0);
  check_input<unsigned_short>(from1,lcp_input1,cache_input1,n1);
  puVar12 = cache_input0 + 1;
  c_00 = *cache_input0;
  local_88 = cache_input1 + 1;
  c = *cache_input1;
  local_c8 = from1;
  local_98 = lcp_input1;
  if (c_00 < c) {
    puVar1 = *from0;
    if (puVar1 == (uchar *)0x0) {
LAB_00247117:
      __assert_fail("a != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x51,"int cmp(const unsigned char *, const unsigned char *)");
    }
    puVar2 = *from1;
    if (puVar2 == (uchar *)0x0) {
LAB_00247136:
      __assert_fail("b != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x52,"int cmp(const unsigned char *, const unsigned char *)");
    }
    iVar4 = strcmp((char *)puVar1,(char *)puVar2);
    if (-1 < iVar4) {
      __assert_fail("cmp(*from0, *from1) < 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x449,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned short]"
                   );
    }
    if (c_00 == c) {
LAB_00247174:
      __assert_fail("a != b or a==0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x3f6,"unsigned int lcp(uint16_t, uint16_t)");
    }
    bVar16 = (c_00 & 0xff00) != 0;
    bVar17 = (c_00 & 0xff00) == (c & 0xff00);
    if (bVar17 && bVar16) {
      if (puVar2[1] == '\0') {
        c = 0;
      }
      else {
        c = CONCAT11(puVar2[1],puVar2[2]);
      }
    }
    *result = puVar1;
    local_d8 = n0 - 1;
    if (local_d8 == 0) {
LAB_00246430:
      __dest = result + 1;
      local_d8 = 0;
      local_a0 = n1;
LAB_00247003:
      if (local_d8 != 0) {
        __assert_fail("n0==0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x51d,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned short]"
                     );
      }
      local_d8 = local_a0;
      if (local_a0 == 0) {
        __assert_fail("n1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x51e,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned short]"
                     );
      }
      goto LAB_00247027;
    }
    from0 = from0 + 1;
    local_b8 = *lcp_input0;
    local_c0 = lcp_input0 + 1;
    local_b0 = (ulong)(bVar17 && bVar16);
    c_00 = cache_input0[1];
    puVar12 = cache_input0 + 2;
LAB_002465d4:
    ppuVar14 = from0;
    __dest = result + 1;
    local_a0 = n1;
    do {
      while( true ) {
        ppuVar13 = __dest;
        ppuVar10 = ppuVar14;
        from0 = ppuVar10;
        lVar8 = 0;
        while( true ) {
          lVar15 = lVar8;
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                              __debug_indent_str_abi_cxx11_._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Starting loop, n0=",0x12);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", n1=",5);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," ...\n",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tprev   = \'",0xb);
          pcVar3 = *(char **)((long)ppuVar13 + lVar15 + -8);
          iVar4 = (int)poVar5;
          if (pcVar3 == (char *)0x0) {
            std::ios::clear(iVar4 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
          }
          else {
            sVar6 = strlen(pcVar3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar3,sVar6);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'\n",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t*from0 = \'",0xb);
          pcVar3 = *(char **)((long)ppuVar10 + lVar15);
          if (pcVar3 == (char *)0x0) {
            std::ios::clear(iVar4 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
          }
          else {
            sVar6 = strlen(pcVar3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar3,sVar6);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'\n",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t*from1 = \'",0xb);
          puVar1 = *local_c8;
          if (puVar1 == (uchar *)0x0) {
            std::ios::clear(iVar4 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
          }
          else {
            sVar6 = strlen((char *)puVar1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)puVar1,sVar6);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'\n",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tlcp0   = ",10);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tlcp1   = ",10);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tcache0 = \'",0xb);
          to_str_abi_cxx11_(&local_70,c_00);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,(char *)CONCAT71(local_70._M_dataplus._M_p._1_7_,
                                                      local_70._M_dataplus._M_p._0_1_),
                              CONCAT44(local_70._M_string_length._4_4_,
                                       (int)local_70._M_string_length));
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'\n",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tcache1 = \'",0xb);
          to_str_abi_cxx11_(&local_50,c);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,local_50._M_dataplus._M_p,local_50._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'\n",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_) !=
              &local_70.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_
                                    ));
          }
          check_lcp_and_cache<unsigned_short>
                    (*(uchar **)((long)ppuVar13 + lVar15 + -8),*(uchar **)((long)ppuVar10 + lVar15),
                     local_b8,c_00,*local_c8,local_b0,c);
          if (local_b8 <= local_b0) break;
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                              __debug_indent_str_abi_cxx11_._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tlcp0 > lcp1\n",0xd);
          pcVar3 = *(char **)((long)ppuVar10 + lVar15);
          if (pcVar3 == (char *)0x0) goto LAB_00247117;
          if (*local_c8 == (uchar *)0x0) goto LAB_00247136;
          iVar4 = strcmp(pcVar3,(char *)*local_c8);
          if (-1 < iVar4) {
            __assert_fail("cmp(*from0, *from1) < 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0x4ae,
                          "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned short]"
                         );
          }
          from0 = from0 + 1;
          *(char **)((long)ppuVar13 + lVar15) = pcVar3;
          local_b8 = *(lcp_t *)((long)local_c0 + lVar15);
          c_00 = *puVar12;
          puVar12 = puVar12 + 1;
          local_d8 = local_d8 - 1;
          lVar8 = lVar15 + 8;
          if (local_d8 == 0) goto LAB_00246ff5;
        }
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                            __debug_indent_str_abi_cxx11_._M_string_length);
        if (local_b8 < local_b0) break;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tlcp0 == lcp1\n",0xe);
        if (c_00 < c) {
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                              __debug_indent_str_abi_cxx11_._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t\tcache0 < cache1\n",0x12);
          pcVar3 = *(char **)((long)ppuVar10 + lVar15);
          if (pcVar3 == (char *)0x0) goto LAB_00247117;
          puVar1 = *local_c8;
          if (puVar1 == (uchar *)0x0) goto LAB_00247136;
          iVar4 = strcmp(pcVar3,(char *)puVar1);
          if (-1 < iVar4) {
            __assert_fail("cmp(*from0, *from1) < 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0x4c6,
                          "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned short]"
                         );
          }
          if (((c_00 & 0xff00) != 0) && ((c_00 & 0xff00) == (c & 0xff00))) {
            if (puVar1[local_b0 + 1] == '\0') {
              c = 0;
              local_b0 = local_b0 + 1;
            }
            else {
              c = CONCAT11(puVar1[local_b0 + 1],puVar1[local_b0 + 2]);
              local_b0 = local_b0 + 1;
            }
          }
          *(char **)((long)ppuVar13 + lVar15) = pcVar3;
          if (local_d8 == 1) {
LAB_00246ff5:
            __dest = (uchar **)((long)ppuVar13 + lVar15 + 8);
            local_d8 = 0;
            goto LAB_00247003;
          }
LAB_00246c03:
          local_d8 = local_d8 - 1;
          c_00 = *puVar12;
          puVar12 = puVar12 + 1;
          local_b8 = *(lcp_t *)((long)local_c0 + lVar15);
          ppuVar14 = (uchar **)((long)ppuVar10 + lVar15 + 8);
          __dest = (uchar **)((long)ppuVar13 + lVar15 + 8);
          local_c0 = (lcp_t *)((long)local_c0 + lVar15) + 1;
        }
        else {
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                              __debug_indent_str_abi_cxx11_._M_string_length);
          if (c < c_00) {
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t\tcache0 > cache1\n",0x12);
            pcVar3 = *(char **)((long)ppuVar10 + lVar15);
            if (pcVar3 == (char *)0x0) goto LAB_00247117;
            puVar1 = *local_c8;
            if (puVar1 == (uchar *)0x0) goto LAB_00247136;
            iVar4 = strcmp(pcVar3,(char *)puVar1);
            if (iVar4 < 1) {
              __assert_fail("cmp(*from0, *from1) > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                            ,0x4d6,
                            "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned short]"
                           );
            }
            if (((c_00 & 0xff00) != 0) && ((c_00 & 0xff00) == (c & 0xff00))) {
              if (pcVar3[local_b8 + 1] == '\0') {
                c_00 = 0;
                local_b8 = local_b8 + 1;
              }
              else {
                c_00 = CONCAT11(pcVar3[local_b8 + 1],pcVar3[local_b8 + 2]);
                local_b8 = local_b8 + 1;
              }
            }
            local_c0 = (lcp_t *)((long)local_c0 + lVar15);
            local_c8 = local_c8 + 1;
            *(undefined8 *)((long)ppuVar13 + lVar15) = puVar1;
            local_b0 = *local_98;
            local_98 = local_98 + 1;
            c = *local_88;
            local_88 = local_88 + 1;
            local_a0 = local_a0 - 1;
            ppuVar14 = (uchar **)(lVar15 + (long)ppuVar10);
            __dest = (uchar **)((undefined8 *)((long)ppuVar13 + lVar15) + 1);
            if (local_a0 == 0) {
              from0 = (uchar **)((long)ppuVar10 + lVar15);
              goto LAB_002470eb;
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t\tcache0 == cache1\n",0x13)
            ;
            if ((char)c_00 == '\0') {
              pcVar3 = *(char **)((long)ppuVar10 + lVar15);
              if (pcVar3 != (char *)0x0) {
                if (*local_c8 != (uchar *)0x0) {
                  iVar4 = strcmp(pcVar3,(char *)*local_c8);
                  if (iVar4 != 0) {
                    __assert_fail("cmp(*from0, *from1) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                                  ,0x4e7,
                                  "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned short]"
                                 );
                  }
                  *(char **)((long)ppuVar13 + lVar15) = pcVar3;
                  if ((c_00 == 0) || (c_00 != c)) {
                    if (local_d8 != 1) {
                      local_b0 = local_b0 + (c_00 != 0 && c_00 == (c & 0xff00));
                      c = 0;
                      goto LAB_00246c03;
                    }
                    goto LAB_00246ff5;
                  }
                  goto LAB_00247174;
                }
                goto LAB_00247136;
              }
              goto LAB_00247117;
            }
            ppuVar14 = (uchar **)(lVar15 + (long)ppuVar10);
            compare((uchar *)&local_70,*(uchar **)((long)ppuVar10 + lVar15),(size_t)*local_c8);
            local_b0 = CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_);
            plVar7 = (lcp_t *)((long)local_c0 + lVar15);
            if ((int)local_70._M_string_length < 0) {
              *(undefined8 *)((long)ppuVar13 + lVar15) = *(undefined8 *)((long)ppuVar10 + lVar15);
              puVar1 = *local_c8;
              if (puVar1 == (uchar *)0x0) goto LAB_0024728b;
              if (puVar1[local_b0] == '\0') {
                c = 0;
              }
              else {
                c = CONCAT11(puVar1[local_b0],puVar1[local_b0 + 1]);
              }
              __dest = (uchar **)((long)ppuVar13 + lVar15 + 8);
              plVar7 = (lcp_t *)((long)local_c0 + lVar15 + 8);
              local_b8 = plVar7[-1];
              c_00 = *puVar12;
LAB_00246f9b:
              ppuVar14 = (uchar **)((long)ppuVar10 + lVar15 + 8);
              puVar12 = puVar12 + 1;
              if (local_d8 == 1) {
                iVar4 = 2;
                local_d8 = 0;
              }
              else {
                local_d8 = local_d8 - 1;
                lVar11 = local_b0;
LAB_00246fc3:
                local_b0 = lVar11;
                iVar4 = 0;
              }
            }
            else {
              __dest = (uchar **)((long)ppuVar13 + lVar15 + 8);
              if ((int)local_70._M_string_length == 0) {
                *(undefined8 *)((long)ppuVar13 + lVar15) = *(undefined8 *)(lVar15 + (long)ppuVar10);
                plVar7 = (lcp_t *)((long)local_c0 + lVar15 + 8);
                local_b8 = plVar7[-1];
                c_00 = *puVar12;
                c = 0;
                goto LAB_00246f9b;
              }
              *(uchar **)((long)ppuVar13 + lVar15) = *local_c8;
              puVar1 = *ppuVar14;
              if (puVar1 == (uchar *)0x0) goto LAB_0024728b;
              if (puVar1[local_b0] == '\0') {
                c_00 = 0;
              }
              else {
                c_00 = CONCAT11(puVar1[local_b0],puVar1[local_b0 + 1]);
              }
              local_c8 = local_c8 + 1;
              lVar11 = *local_98;
              local_98 = local_98 + 1;
              c = *local_88;
              local_88 = local_88 + 1;
              local_a0 = local_a0 - 1;
              local_b8 = local_b0;
              if (local_a0 != 0) goto LAB_00246fc3;
              iVar4 = 3;
              local_a0 = 0;
              local_b0 = lVar11;
            }
            local_c0 = plVar7;
            if (iVar4 != 0) {
              if (iVar4 == 1) {
                return;
              }
              from0 = ppuVar14;
              if (iVar4 == 2) goto LAB_00247003;
              goto LAB_002470f1;
            }
          }
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tlcp0 < lcp1\n",0xd);
      if (*(char **)((long)ppuVar10 + lVar15) == (char *)0x0) goto LAB_00247117;
      puVar1 = *local_c8;
      if (puVar1 == (uchar *)0x0) goto LAB_00247136;
      iVar4 = strcmp(*(char **)((long)ppuVar10 + lVar15),(char *)puVar1);
      if (iVar4 < 1) {
        __assert_fail("cmp(*from0, *from1) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x4b7,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned short]"
                     );
      }
      local_c0 = (lcp_t *)((long)local_c0 + lVar15);
      local_c8 = local_c8 + 1;
      *(undefined8 *)((long)ppuVar13 + lVar15) = puVar1;
      local_b0 = *local_98;
      local_98 = local_98 + 1;
      c = *local_88;
      local_88 = local_88 + 1;
      local_a0 = local_a0 - 1;
      ppuVar14 = (uchar **)((long)ppuVar10 + lVar15);
      __dest = (uchar **)((undefined8 *)((long)ppuVar13 + lVar15) + 1);
    } while (local_a0 != 0);
LAB_002470eb:
    __dest = (uchar **)((long)ppuVar13 + lVar15 + 8);
  }
  else {
    if (c_00 <= c) {
      if ((char)c_00 != '\0') {
        compare((uchar *)&local_70,*from0,(size_t)*from1);
        lVar11 = CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_);
        if ((int)local_70._M_string_length < 0) {
          *result = *from0;
          if (*from1 == (uchar *)0x0) {
LAB_0024728b:
            __assert_fail("ptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                          ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
          }
          if (n0 == 1) {
            lVar8 = 2;
            goto LAB_002465c2;
          }
        }
        else if ((int)local_70._M_string_length == 0) {
          *result = *from0;
          if (n0 == 1) {
            lVar8 = 2;
            goto LAB_002465c2;
          }
        }
        else {
          *result = *from1;
          if (*from0 == (uchar *)0x0) goto LAB_0024728b;
          lVar11 = *lcp_input1;
          if (n1 == 1) {
            lVar8 = 3;
            goto LAB_002465c2;
          }
        }
        lVar8 = 0;
LAB_002465c2:
        (*(code *)((long)&DAT_00269010 + (long)(int)(&DAT_00269010)[lVar8]))(lVar11);
        return;
      }
      puVar1 = *from0;
      if (puVar1 == (uchar *)0x0) goto LAB_00247117;
      if (*from1 == (uchar *)0x0) goto LAB_00247136;
      iVar4 = strcmp((char *)puVar1,(char *)*from1);
      if (iVar4 != 0) {
        __assert_fail("cmp(*from0, *from1) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x470,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned short]"
                     );
      }
      if (c_00 != 0 && c_00 == c) goto LAB_00247174;
      uVar9 = c & 0xff00;
      *result = puVar1;
      local_d8 = n0 - 1;
      if (local_d8 == 0) goto LAB_00246430;
      c = 0;
      from0 = from0 + 1;
      local_b8 = *lcp_input0;
      local_c0 = lcp_input0 + 1;
      local_b0 = (ulong)(c_00 != 0 && c_00 == uVar9);
      c_00 = cache_input0[1];
      puVar12 = cache_input0 + 2;
      goto LAB_002465d4;
    }
    puVar1 = *from0;
    if (puVar1 == (uchar *)0x0) goto LAB_00247117;
    puVar2 = *from1;
    if (puVar2 == (uchar *)0x0) goto LAB_00247136;
    iVar4 = strcmp((char *)puVar1,(char *)puVar2);
    if (iVar4 < 1) {
      __assert_fail("cmp(*from0, *from1) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x45c,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned short]"
                   );
    }
    if (c_00 == c) goto LAB_00247174;
    bVar16 = (c_00 & 0xff00) != 0;
    bVar17 = (c_00 & 0xff00) == (c & 0xff00);
    if (bVar17 && bVar16) {
      if (puVar1[1] == '\0') {
        c_00 = 0;
      }
      else {
        c_00 = CONCAT11(puVar1[1],puVar1[2]);
      }
    }
    *result = puVar2;
    __dest = result + 1;
    n1 = n1 - 1;
    local_d8 = n0;
    if (n1 != 0) {
      local_c8 = from1 + 1;
      local_b8 = (lcp_t)(bVar17 && bVar16);
      local_b0 = *lcp_input1;
      local_98 = lcp_input1 + 1;
      c = cache_input1[1];
      local_88 = cache_input1 + 2;
      local_c0 = lcp_input0;
      goto LAB_002465d4;
    }
  }
  local_a0 = 0;
LAB_002470f1:
  local_c8 = from0;
  if (local_d8 == 0) {
    __assert_fail("n0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x527,
                  "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned short]"
                 );
  }
  if (local_a0 != 0) {
    __assert_fail("n1==0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x528,
                  "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned short]"
                 );
  }
LAB_00247027:
  memmove(__dest,local_c8,local_d8 << 3);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  local_70._M_dataplus._M_p._0_1_ = 0x7e;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_70,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"merge_cache_lcp_2way",0x14);
  local_70._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_70,1);
  return;
}

Assistant:

void
merge_cache_lcp_2way(
       unsigned char** from0,  lcp_t* restrict lcp_input0, CharT* restrict cache_input0, size_t n0,
       unsigned char** from1,  lcp_t* restrict lcp_input1, CharT* restrict cache_input1, size_t n1,
       unsigned char** result, lcp_t* restrict lcp_result, CharT* restrict cache_result)
{
	debug() << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';

	check_input(from0, lcp_input0, cache_input0, n0);
	check_input(from1, lcp_input1, cache_input1, n1);

	lcp_t lcp0=0, lcp1=0;
	CharT cache0 = *cache_input0++;
	CharT cache1 = *cache_input1++;
	{
		stat_try_cache();
		if (cache0 < cache1) {
			assert(cmp(*from0, *from1) < 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache1 = get_char<CharT>(*from1, l);
				}
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				lcp1 = l;
				cache0 = *cache_input0++;
			} else {
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
			}
			if (--n0 == 0) goto finish0;
		} else if (cache0 > cache1) {
			assert(cmp(*from0, *from1) > 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache0 = get_char<CharT>(*from0, l);
				}
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp0 = l;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			} else {
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			}
			if (--n1 == 0) goto finish1;
		} else {
			if (is_end(cache0)) {
				assert(cmp(*from0, *from1) == 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = l;
					cache0 = *cache_input0++;
					cache1 = 0;
				} else {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					cache0 = *cache_input0++;
					cache1 = 0;
				}
				if (--n0 == 0) goto finish0;
			} else {
				stat_cache_useless();
				int cmp01; lcp_t lcp01;
				std::tie(cmp01, lcp01) = compare(*from0, *from1, sizeof(CharT));
				if (cmp01 < 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = get_char<CharT>(*from1, lcp01);
					if (--n0 == 0) goto finish0;
				} else if (cmp01 == 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = 0;
					if (--n0 == 0) goto finish0;
				} else {
					*result++ = *from1++;
					if (OutputLCP) *cache_result++ = cache1;
					lcp0 = lcp01;
					lcp1 = *lcp_input1++;
					cache0 = get_char<CharT>(*from0, lcp01);
					cache1 = *cache_input1++;
					if (--n1 == 0) goto finish1;
				}
			}
		}
	}
	while (true) {
		debug() << "Starting loop, n0="<<n0<<", n1="<<n1<<" ...\n"
			<< "\tprev   = '"<<*(result-1)<<"'\n"
			<< "\t*from0 = '"<<*from0<<"'\n"
			<< "\t*from1 = '"<<*from1<<"'\n"
			<< "\tlcp0   = " <<lcp0<<"\n"
			<< "\tlcp1   = " <<lcp1<<"\n"
			<< "\tcache0 = '"<<to_str(cache0)<<"'\n"
			<< "\tcache1 = '"<<to_str(cache1)<<"'\n"
			<< "\n";
		check_lcp_and_cache(*(result-1),*from0,lcp0,cache0,*from1,lcp1,cache1);
		if (lcp0 > lcp1) {
			debug() << "\tlcp0 > lcp1\n";
			assert(cmp(*from0, *from1) < 0);
			*result++ = *from0++;
			if (OutputLCP) *lcp_result++ = lcp0;
			if (OutputLCP) *cache_result++ = cache0;
			lcp0 = *lcp_input0++;
			cache0 = *cache_input0++;
			if (--n0 == 0) goto finish0;
		} else if (lcp0 < lcp1) {
			debug() << "\tlcp0 < lcp1\n";
			assert(cmp(*from0, *from1) > 0);
			*result++ = *from1++;
			if (OutputLCP) *lcp_result++ = lcp1;
			if (OutputLCP) *cache_result++ = cache1;
			lcp1 = *lcp_input1++;
			cache1 = *cache_input1++;
			if (--n1 == 0) goto finish1;
		} else {
			debug() << "\tlcp0 == lcp1\n";
			stat_try_cache();
			// Both strings in the sorted sequences have the same
			// prefix than the latest string in output. Check
			// cached characters first.
			if (cache0 < cache1) {
				debug() << "\t\tcache0 < cache1\n";
				assert(cmp(*from0, *from1) < 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp1 += l;
						cache1 = get_char<CharT>(*from1, lcp1);
					}
				}
				*result++ = *from0++;
				if (OutputLCP) *lcp_result++ = lcp0;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
				if (--n0 == 0) goto finish0;
			} else if (cache0 > cache1) {
				debug() << "\t\tcache0 > cache1\n";
				assert(cmp(*from0, *from1) > 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp0 += l;
						cache0 = get_char<CharT>(*from0, lcp0);
					}
				}
				*result++ = *from1++;
				if (OutputLCP) *lcp_result++ = lcp1;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
				if (--n1 == 0) goto finish1;
			} else {
				debug() << "\t\tcache0 == cache1\n";
				if (is_end(cache0)) {
					assert(cmp(*from0, *from1) == 0);
					if (sizeof(CharT) > 1) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 += lcp(cache0, cache1);
						cache0 = *cache_input0++;
						cache1 = 0;
					} else {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						cache0 = *cache_input0++;
					}
					if (--n0 == 0) goto finish0;
				} else {
					stat_cache_useless();
					int cmp01; lcp_t lcp01;
					std::tie(cmp01, lcp01) = compare(*from0, *from1, lcp0+sizeof(CharT));
					if (cmp01 < 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = get_char<CharT>(*from1, lcp01);
						if (--n0 == 0) goto finish0;
					} else if (cmp01 == 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = 0;
						if (--n0 == 0) goto finish0;
					} else {
						*result++ = *from1++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = lcp01;
						lcp1 = *lcp_input1++;
						cache0 = get_char<CharT>(*from0, lcp01);
						cache1 = *cache_input1++;
						if (--n1 == 0) goto finish1;
					}
				}
			}
		}
	}
finish0:
	assert(n0==0);
	assert(n1);
	if (OutputLCP) *lcp_result++ = lcp1;
	if (OutputLCP) *cache_result++ = cache1;
	std::copy(from1, from1+n1, result);
	if (OutputLCP) std::copy(lcp_input1, lcp_input1+n1, lcp_result);
	if (OutputLCP) std::copy(cache_input1, cache_input1+n1, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
finish1:
	assert(n0);
	assert(n1==0);
	if (OutputLCP) *lcp_result++ = lcp0;
	if (OutputLCP) *cache_result++ = cache0;
	std::copy(from0, from0+n0, result);
	if (OutputLCP) std::copy(lcp_input0, lcp_input0+n0, lcp_result);
	if (OutputLCP) std::copy(cache_input0, cache_input0+n0, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
}